

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::NativeString_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field)

{
  ulong uVar1;
  string *local_b8;
  Value *local_a8;
  allocator<char> local_69;
  string *local_68;
  string *ret;
  byte local_4a;
  allocator<char> local_49;
  string local_48;
  Value *local_28;
  Value *attr;
  FieldDef *field_local;
  CppGenerator *this_local;
  
  local_4a = 0;
  ret._3_1_ = 0;
  attr = (Value *)field;
  field_local = (FieldDef *)this;
  this_local = (CppGenerator *)__return_storage_ptr__;
  if (field == (FieldDef *)0x0) {
    local_a8 = (Value *)0x0;
  }
  else {
    std::allocator<char>::allocator();
    local_4a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"cpp_str_type",&local_49)
    ;
    ret._3_1_ = 1;
    local_a8 = SymbolTable<flatbuffers::Value>::Lookup
                         (&(field->super_Definition).attributes,&local_48);
  }
  if ((ret._3_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_48);
  }
  if ((local_4a & 1) != 0) {
    std::allocator<char>::~allocator(&local_49);
  }
  local_28 = local_a8;
  if (local_a8 == (Value *)0x0) {
    local_b8 = (string *)&(this->opts_).super_IDLOptions.cpp_object_api_string_type;
  }
  else {
    local_b8 = (string *)&local_a8->constant;
  }
  local_68 = local_b8;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_68);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"std::string",&local_69);
    std::allocator<char>::~allocator(&local_69);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string NativeString(const FieldDef *field) {
    auto attr = field ? field->attributes.Lookup("cpp_str_type") : nullptr;
    auto &ret = attr ? attr->constant : opts_.cpp_object_api_string_type;
    if (ret.empty()) { return "std::string"; }
    return ret;
  }